

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O1

void __thiscall SHOPManagement::Person::changePhoneNumber(Person *this)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  string new_value;
  long *local_58;
  long local_50;
  long local_48 [2];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Phone Number(",0xd);
  pcVar1 = (this->m_phone_number)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->m_phone_number)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  std::istream::ignore();
  cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '@');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_38,cVar2);
  if (local_30 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->m_phone_number);
    std::__cxx11::string::_M_replace(0x111240,0,DAT_00111248,0x10c5c4);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

void Person::changePhoneNumber()
    {
        std::string new_value;
        std::cout << "Phone Number(" << this->getPhoneNumber() << "): ";
        std::cin.ignore();
        std::getline(std::cin, new_value);

        if (!new_value.empty())
        {
            this->setPhoneNumber(new_value);
            Helper::m_message = "Phone number has been changed successfully.";
        }
    }